

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O3

unsigned_long __thiscall
gmlc::utilities::numeric_conversion<unsigned_long>
          (utilities *this,string_view V,unsigned_long defValue)

{
  char *pcVar1;
  string_view input;
  
  pcVar1 = V._M_str;
  input._M_len = (byte *)V._M_len;
  if ((this != (utilities *)0x0) && (numCheck[*input._M_len] == '\x01')) {
    input._M_str = (char *)0x0;
    pcVar1 = (char *)strViewToInteger<unsigned_long>(this,input,(size_t *)numCheck);
  }
  return (unsigned_long)pcVar1;
}

Assistant:

X numeric_conversion(std::string_view V, const X defValue)
{
    if (nonNumericFirstCharacter(V)) {
        return defValue;
    }
    try {
        return numConv<X>(V);
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}